

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::descriptor_unittest::EnumDescriptorTest_FindValueByNumber_Test::
EnumDescriptorTest_FindValueByNumber_Test(EnumDescriptorTest_FindValueByNumber_Test *this)

{
  testing::Test::Test((Test *)this);
  (this->super_EnumDescriptorTest).super_Test._vptr_Test =
       (_func_int **)&PTR__EnumDescriptorTest_01882d58;
  DescriptorPool::DescriptorPool(&(this->super_EnumDescriptorTest).pool_);
  (this->super_EnumDescriptorTest).super_Test._vptr_Test =
       (_func_int **)&PTR__EnumDescriptorTest_01877c00;
  return;
}

Assistant:

TEST_F(EnumDescriptorTest, FindValueByNumber) {
  EXPECT_EQ(foo_, enum_->FindValueByNumber(1));
  EXPECT_EQ(bar_, enum_->FindValueByNumber(2));
  EXPECT_EQ(foo2_, enum2_->FindValueByNumber(1));
  EXPECT_EQ(baz2_, enum2_->FindValueByNumber(3));

  EXPECT_TRUE(enum_->FindValueByNumber(416) == nullptr);
  EXPECT_TRUE(enum_->FindValueByNumber(3) == nullptr);
  EXPECT_TRUE(enum2_->FindValueByNumber(2) == nullptr);
}